

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptAsyncGenerator * __thiscall
Js::JavascriptLibrary::CreateAsyncGenerator
          (JavascriptLibrary *this,Arguments *args,ScriptFunction *scriptFunction,
          RecyclableObject *prototype)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *typeHandler;
  DynamicType *generatorType;
  JavascriptAsyncGenerator *pJVar4;
  ScriptContext *scriptContext;
  
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (((scriptContext->config).threadConfig)->m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1854,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  recycler = this->recycler;
  typeHandler = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  generatorType =
       DynamicType::New(scriptContext,TypeIds_AsyncGenerator,prototype,(JavascriptMethod)0x0,
                        typeHandler,false,false);
  pJVar4 = JavascriptAsyncGenerator::New(recycler,generatorType,args,scriptFunction);
  return pJVar4;
}

Assistant:

JavascriptAsyncGenerator* JavascriptLibrary::CreateAsyncGenerator(
        Arguments& args,
        ScriptFunction* scriptFunction,
        RecyclableObject* prototype)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());
        return JavascriptAsyncGenerator::New(
            GetRecycler(),
            CreateAsyncGeneratorType(prototype),
            args,
            scriptFunction);
    }